

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

CmpResultSet
tcu::execCompare(CompareMode compareMode,float cmpValue_,float cmpReference_,int referenceBits,
                bool isFixedPoint)

{
  bool bVar1;
  float fVar2;
  bool local_42;
  bool local_41;
  float local_34;
  float err;
  float cmpReference;
  float cmpValue;
  bool clampValues;
  bool isFixedPoint_local;
  int referenceBits_local;
  float cmpReference__local;
  float cmpValue__local;
  CompareMode compareMode_local;
  CmpResultSet res;
  
  local_34 = cmpReference_;
  if (isFixedPoint) {
    cmpValue_ = de::clamp<float>(cmpValue_,0.0,1.0);
    local_34 = de::clamp<float>(cmpReference_,0.0,1.0);
  }
  fVar2 = TexVerifierUtil::computeFixedPointError(referenceBits);
  CmpResultSet::CmpResultSet((CmpResultSet *)((long)&cmpValue__local + 2));
  switch(compareMode) {
  case COMPAREMODE_LESS:
    cmpValue__local._2_2_ =
         (CmpResultSet)CONCAT11(cmpValue_ <= local_34 + fVar2,local_34 - fVar2 < cmpValue_);
    break;
  case COMPAREMODE_LESS_OR_EQUAL:
    cmpValue__local._2_2_ =
         (CmpResultSet)CONCAT11(cmpValue_ < local_34 + fVar2,local_34 - fVar2 <= cmpValue_);
    break;
  case COMPAREMODE_GREATER:
    cmpValue__local._2_2_ =
         (CmpResultSet)CONCAT11(local_34 - fVar2 <= cmpValue_,cmpValue_ < local_34 + fVar2);
    break;
  case COMPAREMODE_GREATER_OR_EQUAL:
    cmpValue__local._2_2_ =
         (CmpResultSet)CONCAT11(local_34 - fVar2 < cmpValue_,cmpValue_ <= local_34 + fVar2);
    break;
  case COMPAREMODE_EQUAL:
    bVar1 = de::inRange<float>(cmpValue_,local_34 - fVar2,local_34 + fVar2);
    local_41 = true;
    if ((fVar2 == 0.0) && (!NAN(fVar2))) {
      local_41 = cmpValue_ != local_34;
    }
    cmpValue__local._2_2_ = (CmpResultSet)CONCAT11(local_41,bVar1);
    break;
  case COMPAREMODE_NOT_EQUAL:
    local_42 = true;
    if ((fVar2 == 0.0) && (!NAN(fVar2))) {
      local_42 = cmpValue_ != local_34;
    }
    cmpValue__local._2_2_ = (CmpResultSet)CONCAT11(cmpValue__local._3_1_,local_42);
    bVar1 = de::inRange<float>(cmpValue_,local_34 - fVar2,local_34 + fVar2);
    cmpValue__local._2_2_ = (CmpResultSet)CONCAT11(bVar1,cmpValue__local._2_1_);
    break;
  case COMPAREMODE_ALWAYS:
    cmpValue__local._2_2_ = (CmpResultSet)CONCAT11(cmpValue__local._3_1_,true);
    break;
  case COMPAREMODE_NEVER:
    cmpValue__local._2_2_ = (CmpResultSet)CONCAT11(true,cmpValue__local._2_1_);
  }
  return cmpValue__local._2_2_;
}

Assistant:

static CmpResultSet execCompare (const Sampler::CompareMode	compareMode,
								 const float				cmpValue_,
								 const float				cmpReference_,
								 const int					referenceBits,
								 const bool					isFixedPoint)
{
	const bool		clampValues		= isFixedPoint;	// if comparing against a floating point texture, ref (and value) is not clamped
	const float		cmpValue		= (clampValues) ? (de::clamp(cmpValue_, 0.0f, 1.0f)) : (cmpValue_);
	const float		cmpReference	= (clampValues) ? (de::clamp(cmpReference_, 0.0f, 1.0f)) : (cmpReference_);
	const float		err				= computeFixedPointError(referenceBits);
	CmpResultSet	res;

	switch (compareMode)
	{
		case Sampler::COMPAREMODE_LESS:
			res.isTrue	= cmpReference-err < cmpValue;
			res.isFalse	= cmpReference+err >= cmpValue;
			break;

		case Sampler::COMPAREMODE_LESS_OR_EQUAL:
			res.isTrue	= cmpReference-err <= cmpValue;
			res.isFalse	= cmpReference+err > cmpValue;
			break;

		case Sampler::COMPAREMODE_GREATER:
			res.isTrue	= cmpReference+err > cmpValue;
			res.isFalse	= cmpReference-err <= cmpValue;
			break;

		case Sampler::COMPAREMODE_GREATER_OR_EQUAL:
			res.isTrue	= cmpReference+err >= cmpValue;
			res.isFalse	= cmpReference-err < cmpValue;
			break;

		case Sampler::COMPAREMODE_EQUAL:
			res.isTrue	= de::inRange(cmpValue, cmpReference-err, cmpReference+err);
			res.isFalse	= err != 0.0f || cmpValue != cmpReference;
			break;

		case Sampler::COMPAREMODE_NOT_EQUAL:
			res.isTrue	= err != 0.0f || cmpValue != cmpReference;
			res.isFalse	= de::inRange(cmpValue, cmpReference-err, cmpReference+err);
			break;

		case Sampler::COMPAREMODE_ALWAYS:
			res.isTrue	= true;
			break;

		case Sampler::COMPAREMODE_NEVER:
			res.isFalse	= true;
			break;

		default:
			DE_ASSERT(false);
	}

	DE_ASSERT(res.isTrue || res.isFalse);
	return res;
}